

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::inverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  Matrix44<float> *pMVar6;
  Matrix44<float> *pMVar7;
  SingMatrixExc *this_00;
  int i;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  Matrix44<float> local_48;
  
  pMVar6 = &local_48;
  pMVar7 = &local_48;
  if ((((this->x[0][3] != 0.0) || (fVar15 = this->x[1][3], fVar15 != 0.0)) || (NAN(fVar15))) ||
     (((fVar15 = this->x[2][3], fVar15 != 0.0 || (NAN(fVar15))) ||
      ((fVar15 = this->x[3][3], fVar15 != 1.0 || (NAN(fVar15))))))) {
    gjInverse(__return_storage_ptr__,this,singExc);
  }
  else {
    fVar15 = this->x[1][1];
    fVar11 = this->x[1][2];
    fVar12 = this->x[0][2];
    fVar1 = this->x[0][0];
    fVar2 = this->x[0][1];
    fVar3 = this->x[2][0];
    fVar4 = this->x[1][0];
    uVar5 = *(undefined8 *)(this->x[2] + 1);
    fVar16 = (float)uVar5;
    fVar17 = (float)((ulong)uVar5 >> 0x20);
    local_48.x[0][0] = fVar15 * fVar17 - fVar11 * fVar16;
    local_48.x[1][0] = fVar3 * fVar11 - fVar17 * fVar4;
    local_48.x[0][1] = fVar12 * fVar16 - fVar17 * fVar2;
    local_48.x[0][2] = fVar2 * fVar11 - fVar12 * fVar15;
    local_48.x[0][3] = 0.0;
    local_48.x[1][1] = fVar17 * fVar1 - fVar12 * fVar3;
    local_48.x[1][2] = fVar12 * fVar4 - fVar11 * fVar1;
    local_48.x[1][3] = 0.0;
    fVar10 = fVar4 * fVar16 - fVar15 * fVar3;
    fVar14 = fVar3 * fVar2 - fVar16 * fVar1;
    local_48.x[2][0] = fVar10;
    local_48.x[2][1] = fVar14;
    local_48.x[2][2] = fVar1 * fVar15 - fVar2 * fVar4;
    local_48.x[2][3] = 0.0;
    local_48.x[3][0] = 0.0;
    local_48.x[3][1] = 0.0;
    local_48.x[3][2] = 0.0;
    local_48.x[3][3] = 1.0;
    fVar11 = fVar10 * fVar12 + local_48.x[0][0] * fVar1 + local_48.x[1][0] * fVar2;
    fVar15 = fVar11;
    if (fVar11 <= -fVar11) {
      fVar15 = -fVar11;
    }
    if (1.0 <= fVar15) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          *(float *)((long)pMVar7 + lVar9 * 4) = *(float *)((long)pMVar7 + lVar9 * 4) / fVar11;
        }
        pMVar7 = (Matrix44<float> *)((long)pMVar7 + 0x10);
      }
    }
    else {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          fVar12 = *(float *)((long)pMVar6 + lVar9 * 4);
          fVar1 = fVar12;
          if (fVar12 <= -fVar12) {
            fVar1 = -fVar12;
          }
          if (fVar15 * 8.507059e+37 <= fVar1) {
            if (!singExc) {
              auVar13._0_12_ = ZEXT812(0);
              auVar13._12_4_ = 0;
              *(undefined1 (*) [16])(__return_storage_ptr__->x[1] + 1) = auVar13;
              *(undefined1 (*) [16])(__return_storage_ptr__->x[2] + 1) = auVar13;
              *(undefined1 (*) [16])(__return_storage_ptr__->x[0] + 1) = auVar13;
              *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
              *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
              __return_storage_ptr__->x[0][0] = 1.0;
              __return_storage_ptr__->x[1][1] = 1.0;
              __return_storage_ptr__->x[2][2] = 1.0;
              __return_storage_ptr__->x[3][3] = 1.0;
              return __return_storage_ptr__;
            }
            this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
            Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
            __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
          }
          *(float *)((long)pMVar6 + lVar9 * 4) = fVar12 / fVar11;
        }
        pMVar6 = (Matrix44<float> *)((long)pMVar6 + 0x10);
      }
    }
    fVar12 = (float)((uint)this->x[3][0] ^ (uint)DAT_02f3b0d0);
    fVar15 = this->x[3][1];
    fVar11 = this->x[3][2];
    local_48.x[3][0] =
         (fVar12 * local_48.x[0][0] - local_48.x[1][0] * fVar15) - fVar11 * local_48.x[2][0];
    local_48.x[3][1] =
         (fVar12 * local_48.x[0][1] - local_48.x[1][1] * fVar15) - fVar11 * local_48.x[2][1];
    local_48.x[3][2] =
         (local_48.x[0][2] * fVar12 - fVar15 * local_48.x[1][2]) - fVar11 * local_48.x[2][2];
    Matrix44(__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T>
Matrix44<T>::inverse (bool singExc) const
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse(singExc);

    Matrix44 s (x[1][1] * x[2][2] - x[2][1] * x[1][2],
                x[2][1] * x[0][2] - x[0][1] * x[2][2],
                x[0][1] * x[1][2] - x[1][1] * x[0][2],
                0,

                x[2][0] * x[1][2] - x[1][0] * x[2][2],
                x[0][0] * x[2][2] - x[2][0] * x[0][2],
                x[1][0] * x[0][2] - x[0][0] * x[1][2],
                0,

                x[1][0] * x[2][1] - x[2][0] * x[1][1],
                x[2][0] * x[0][1] - x[0][0] * x[2][1],
                x[0][0] * x[1][1] - x[1][0] * x[0][1],
                0,

                0,
                0,
                0,
                1);

    T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s[i][j] /= r;
            }
        }
    }
    else
    {
        T mr = IMATH_INTERNAL_NAMESPACE::abs (r) / limits<T>::smallest();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s[i][j]))
                {
                    s[i][j] /= r;
                }
                else
                {
                    if (singExc)
                        throw SingMatrixExc ("Cannot invert singular matrix.");

                    return Matrix44();
                }
            }
        }
    }

    s[3][0] = -x[3][0] * s[0][0] - x[3][1] * s[1][0] - x[3][2] * s[2][0];
    s[3][1] = -x[3][0] * s[0][1] - x[3][1] * s[1][1] - x[3][2] * s[2][1];
    s[3][2] = -x[3][0] * s[0][2] - x[3][1] * s[1][2] - x[3][2] * s[2][2];

    return s;
}